

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O3

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Library>
          (Structure *this,Library *dest,FileDatabase *db)

{
  ReadField<2,Assimp::Blender::ID>(this,&dest->id,"id",db);
  ReadFieldArray<1,char,240ul>(this,&dest->name,"name",db);
  ReadFieldArray<2,char,240ul>(this,&dest->filename,"filename",db);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Library>(this,&dest->parent,"*parent",db,false);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<Library> (
    Library& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.id,"id",db);
    ReadFieldArray<ErrorPolicy_Warn>(dest.name,"name",db);
    ReadFieldArray<ErrorPolicy_Fail>(dest.filename,"filename",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.parent,"*parent",db);

    db.reader->IncPtr(size);
}